

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.cpp
# Opt level: O2

void __thiscall argo::json_exception::json_exception(json_exception *this,exception_type et)

{
  char *__src;
  
  *(undefined ***)this = &PTR__exception_0011b980;
  this->m_type = et;
  switch(et) {
  case invalid_json_type_e:
    __src = "internal error, invalid json instance type";
    break;
  default:
    __src = "generic";
    break;
  case not_number_e:
    __src = "instance is not a number";
    break;
  case cant_compare_raw_e:
    __src = "raw values can\'t be compared";
    break;
  case cant_cast_raw_e:
    __src = "raw values can\'t be cast";
    break;
  case pointer_not_matched_e:
    __src = "pointer doesn\'t match a location in the instance";
    break;
  case pointer_token_type_invalid_e:
    __src = "pointer token type is invalid";
  }
  strncpy(this->m_message,__src,200);
  return;
}

Assistant:

json_exception::json_exception(exception_type et) noexcept : exception(), m_type(et)
{
    switch (et)
    {
    case invalid_json_type_e:
        strncpy(m_message, "internal error, invalid json instance type", max_message_length);
        break;
    case not_number_e:
        strncpy(m_message, "instance is not a number", max_message_length);
        break;
    case cant_compare_raw_e:
        strncpy(m_message, "raw values can't be compared", max_message_length);
        break;
    case cant_cast_raw_e:
        strncpy(m_message, "raw values can't be cast", max_message_length);
        break;
    case pointer_not_matched_e:
        strncpy(m_message, "pointer doesn't match a location in the instance", max_message_length);
        break;
    case pointer_token_type_invalid_e:
        strncpy(m_message, "pointer token type is invalid", max_message_length);
        break;
    default:
        strncpy(m_message, "generic", max_message_length);
        break;
    }
}